

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::BinaryOp<5,_(rsg::Associativity)0>::evaluate
          (BinaryOp<5,_(rsg::Associativity)0> *this,ExecutionContext *execCtx)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  StridedValueAccess<64> SVar3;
  VariableType *local_48;
  ExecValueAccess dst;
  ExecConstValueAccess rightVal;
  ExecConstValueAccess leftVal;
  ExecutionContext *execCtx_local;
  BinaryOp<5,_(rsg::Associativity)0> *this_local;
  
  (*this->m_leftValueExpr->_vptr_Expression[4])(this->m_leftValueExpr,execCtx);
  (*this->m_rightValueExpr->_vptr_Expression[4])(this->m_rightValueExpr,execCtx);
  iVar1 = (*this->m_leftValueExpr->_vptr_Expression[5])();
  iVar2 = (*this->m_rightValueExpr->_vptr_Expression[5])();
  SVar3 = ValueStorage<64>::getValue(&this->m_value,&this->m_type);
  local_48 = SVar3.super_ConstStridedValueAccess<64>.m_type;
  dst.super_ConstStridedValueAccess<64>.m_type =
       (VariableType *)SVar3.super_ConstStridedValueAccess<64>.m_value;
  (*(this->super_Expression)._vptr_Expression[7])
            (this,local_48,dst.super_ConstStridedValueAccess<64>.m_type,CONCAT44(extraout_var,iVar1)
             ,extraout_RDX,extraout_RDX_00,CONCAT44(extraout_var_00,iVar2),extraout_RDX_00);
  return;
}

Assistant:

void BinaryOp<Precedence, Assoc>::evaluate (ExecutionContext& execCtx)
{
	m_leftValueExpr->evaluate(execCtx);
	m_rightValueExpr->evaluate(execCtx);

	ExecConstValueAccess	leftVal		= m_leftValueExpr->getValue();
	ExecConstValueAccess	rightVal	= m_rightValueExpr->getValue();
	ExecValueAccess			dst			= m_value.getValue(m_type);

	evaluate(dst, leftVal, rightVal);
}